

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_t.cpp
# Opt level: O2

void __thiscall deci::string_t::string_t(string_t *this,string_t *copy)

{
  (this->super_value_t).hash = (copy->super_value_t).hash;
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0010fd58;
  std::__cxx11::string::string((string *)&this->val,(string *)&copy->val);
  return;
}

Assistant:

string_t::string_t(const string_t& copy):value_t(copy),val(copy.val) {
      ;
    }